

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

string * anon_unknown.dwarf_1aacf::getIDLAbsoluteNamespace
                   (string *__return_storage_ptr__,string *type_ns,IDLExport *exporter)

{
  string suffix;
  string prefix;
  string local_70 [8];
  long local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)type_ns);
  std::__cxx11::string::string((string *)&local_50,(string *)&exporter->m_ns_prefix);
  std::__cxx11::string::string(local_70,(string *)&exporter->m_ns_suffix);
  if (local_50._M_string_length != 0) {
    std::operator+(&local_30,&local_50,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if (local_68 != 0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static string getIDLAbsoluteNamespace(std::string const& type_ns, IDLExport const& exporter)
    {
        string ns = type_ns;
        string prefix = exporter.getNamespacePrefix();
        string suffix = exporter.getNamespaceSuffix();
        if (!prefix.empty())
            ns = prefix + ns;
        if (!suffix.empty())
            ns += suffix;
        return ns;
    }